

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

PDFObject * __thiscall
PDFObjectParser::ParseHexadecimalString(PDFObjectParser *this,string *inToken)

{
  string *psVar1;
  char *pcVar2;
  Trace *this_00;
  undefined8 uVar3;
  PDFHexString *this_01;
  string local_b0;
  string local_90;
  string local_70;
  string local_40 [32];
  string *local_20;
  string *inToken_local;
  PDFObjectParser *this_local;
  
  local_20 = inToken;
  inToken_local = (string *)this;
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::at((ulong)inToken);
  if (*pcVar2 == '>') {
    this_01 = (PDFHexString *)operator_new(0x68);
    psVar1 = local_20;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar1);
    DecodeHexString(&local_90,this,&local_b0);
    MaybeDecryptString(&local_70,this,&local_90);
    PDFHexString::PDFHexString(this_01,&local_70);
    this_local = (PDFObjectParser *)this_01;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    this_00 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)local_40,(ulong)local_20);
    uVar3 = std::__cxx11::string::c_str();
    Trace::TraceToLog(this_00,
                      "PDFObjectParser::ParseHexadecimalString, exception in parsing hexadecimal string, no closing angle, Expression: %s"
                      ,uVar3);
    std::__cxx11::string::~string(local_40);
    this_local = (PDFObjectParser *)0x0;
  }
  return (PDFObject *)this_local;
}

Assistant:

PDFObject* PDFObjectParser::ParseHexadecimalString(const std::string& inToken)
{
	// verify that last character is '>'
	if(inToken.at(inToken.size()-1) != scRightAngle)
	{
		TRACE_LOG1("PDFObjectParser::ParseHexadecimalString, exception in parsing hexadecimal string, no closing angle, Expression: %s",inToken.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}

	return new PDFHexString(MaybeDecryptString(DecodeHexString(inToken.substr(1, inToken.size() - 2))));
}